

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O0

int ngram_search_find_exit(ngram_search_t *ngs,int frame_idx,int32 *out_best_score)

{
  int iVar1;
  bool bVar2;
  int local_38;
  int local_34;
  int32 best_score;
  int bp;
  int best_exit;
  int end_bpidx;
  int32 *out_best_score_local;
  int frame_idx_local;
  ngram_search_t *ngs_local;
  
  if (ngs->n_frame == 0) {
    ngs_local._4_4_ = -1;
  }
  else {
    if ((frame_idx == -1) || (out_best_score_local._4_4_ = frame_idx, ngs->n_frame <= frame_idx)) {
      out_best_score_local._4_4_ = ngs->n_frame + -1;
    }
    iVar1 = ngs->bp_table_idx[out_best_score_local._4_4_];
    local_38 = -0x20000000;
    best_score = -1;
    while( true ) {
      bVar2 = false;
      if (-1 < out_best_score_local._4_4_) {
        bVar2 = ngs->bp_table_idx[out_best_score_local._4_4_] == iVar1;
      }
      if (!bVar2) break;
      out_best_score_local._4_4_ = out_best_score_local._4_4_ + -1;
    }
    if (out_best_score_local._4_4_ < 0) {
      ngs_local._4_4_ = -1;
    }
    else {
      if (ngs->bp_table_size <= iVar1) {
        __assert_fail("end_bpidx < ngs->bp_table_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                      ,0x20f,"int ngram_search_find_exit(ngram_search_t *, int, int32 *)");
      }
      for (local_34 = ngs->bp_table_idx[out_best_score_local._4_4_]; local_34 < iVar1;
          local_34 = local_34 + 1) {
        if ((ngs->bp_table[local_34].wid == (ngs->base).finish_wid) ||
           (local_38 < ngs->bp_table[local_34].score)) {
          local_38 = ngs->bp_table[local_34].score;
          best_score = local_34;
        }
        if (ngs->bp_table[local_34].wid == (ngs->base).finish_wid) break;
      }
      if (out_best_score != (int32 *)0x0) {
        *out_best_score = local_38;
      }
      ngs_local._4_4_ = best_score;
    }
  }
  return ngs_local._4_4_;
}

Assistant:

int
ngram_search_find_exit(ngram_search_t *ngs, int frame_idx, int32 *out_best_score)
{
    /* End of backpointers for this frame. */
    int end_bpidx;
    int best_exit, bp;
    int32 best_score;

    /* No hypothesis means no exit node! */
    if (ngs->n_frame == 0)
        return NO_BP;

    if (frame_idx == -1 || frame_idx >= ngs->n_frame)
        frame_idx = ngs->n_frame - 1;
    end_bpidx = ngs->bp_table_idx[frame_idx];

    best_score = WORST_SCORE;
    best_exit = NO_BP;

    /* Scan back to find a frame with some backpointers in it. */
    while (frame_idx >= 0 && ngs->bp_table_idx[frame_idx] == end_bpidx)
        --frame_idx;
    /* This is NOT an error, it just means there is no hypothesis yet. */
    if (frame_idx < 0)
        return NO_BP;

    /* Now find the entry for </s> OR the best scoring entry. */
    assert(end_bpidx < ngs->bp_table_size);
    for (bp = ngs->bp_table_idx[frame_idx]; bp < end_bpidx; ++bp) {
        if (ngs->bp_table[bp].wid == ps_search_finish_wid(ngs)
            || ngs->bp_table[bp].score BETTER_THAN best_score) {
            best_score = ngs->bp_table[bp].score;
            best_exit = bp;
        }
        if (ngs->bp_table[bp].wid == ps_search_finish_wid(ngs))
            break;
    }

    if (out_best_score) {
	*out_best_score = best_score;
    }
    return best_exit;
}